

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr_time.c
# Opt level: O2

void chr_get_time(chr_time *time)

{
  gettimeofday((timeval *)time,(__timezone_ptr_t)0x0);
  return;
}

Assistant:

extern void
chr_get_time( chr_time *time)
{
#ifdef HAVE_GETTIMEOFDAY
    gettimeofday((struct timeval*)time, NULL);
#else
    /* GSE...  No gettimeofday on windows.  
     * Must use _ftime, get millisec time, convert to usec.  Bleh.
     */
    struct _timeb nowb;
    _ftime(&nowb);
    ((struct timeval*)time)->tv_sec = (long)nowb.time;
    ((struct timeval*)time)->tv_usec = nowb.millitm * 1000;
#endif
    //    gettimeofday((struct timeval *) time, NULL);
}